

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CampaignReader.cpp
# Opt level: O0

string * __thiscall
adios2::core::engine::CampaignReader::VariableExprStr_abi_cxx11_
          (CampaignReader *this,VariableBase *Var)

{
  bool bVar1;
  pointer ppVar2;
  reference ppEVar3;
  long in_RSI;
  string *in_RDI;
  Engine *e;
  VariableBase *vb;
  iterator it;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignReader::VarInternalInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignReader::VarInternalInfo>_>_>
  *in_stack_ffffffffffffff88;
  allocator *paVar4;
  allocator local_39;
  value_type local_38;
  void *local_30;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignReader::VarInternalInfo>,_true>
  local_28;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignReader::VarInternalInfo>,_true>
  local_20 [4];
  
  local_20[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignReader::VarInternalInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignReader::VarInternalInfo>_>_>
       ::find(in_stack_ffffffffffffff88,(key_type *)0xd8e00f);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignReader::VarInternalInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignReader::VarInternalInfo>_>_>
       ::end(in_stack_ffffffffffffff88);
  bVar1 = std::__detail::operator!=(local_20,&local_28);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignReader::VarInternalInfo>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignReader::VarInternalInfo>,_false,_true>
                           *)0xd8e049);
    local_30 = (ppVar2->second).originalVar;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignReader::VarInternalInfo>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignReader::VarInternalInfo>,_false,_true>
                           *)0xd8e06f);
    ppEVar3 = std::vector<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>::
              operator[]((vector<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_> *)
                         (in_RSI + 0x150),(ppVar2->second).engineIdx);
    local_38 = *ppEVar3;
    (*local_38->_vptr_Engine[0xf])(in_RDI,local_38,local_30);
  }
  else {
    paVar4 = &local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",paVar4);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return in_RDI;
}

Assistant:

std::string CampaignReader::VariableExprStr(const VariableBase &Var)
{
    auto it = m_VarInternalInfo.find(Var.m_Name);
    if (it != m_VarInternalInfo.end())
    {
        VariableBase *vb = reinterpret_cast<VariableBase *>(it->second.originalVar);
        Engine *e = m_Engines[it->second.engineIdx];
        return e->VariableExprStr(*vb);
    }
    return "";
}